

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

mask * csv_whitespace::make_table(void)

{
  mask *__dest;
  void *__src;
  
  __dest = (mask *)operator_new__(0x200);
  __src = (void *)std::ctype<char>::classic_table();
  memcpy(__dest,__src,0x200);
  *(byte *)((long)__dest + 0x59) = *(byte *)((long)__dest + 0x59) | 0x20;
  __dest[0x20] = 0xc04;
  return __dest;
}

Assistant:

static mask* make_table()
    {
        auto* v = new mask[table_size];
        std::copy_n(classic_table(), table_size, v);

        // Comma will be classified as whitespace.
        v[static_cast<int>(',')] |= space;

        // Space will be classified as character with graphic representation.
        v[static_cast<int>(' ')] = graph;

        return v;
    }